

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  PragmaExpressionSyntax *node;
  NameValuePragmaExpressionSyntax *pNVar1;
  Token TVar2;
  BumpAllocator *unaff_retaddr;
  BumpAllocator *in_stack_00000118;
  Token *in_stack_00000120;
  Info *args_2;
  Token *args_1;
  
  args_1 = (Token *)__child_stack;
  TVar2 = parsing::Token::deepClone(in_stack_00000120,in_stack_00000118);
  args_2 = TVar2.info;
  TVar2 = parsing::Token::deepClone(in_stack_00000120,in_stack_00000118);
  node = TVar2._0_8_;
  not_null<slang::syntax::PragmaExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::PragmaExpressionSyntax_*> *)0x81ddef);
  deepClone<slang::syntax::PragmaExpressionSyntax>(node,(BumpAllocator *)__child_stack);
  pNVar1 = BumpAllocator::
           emplace<slang::syntax::NameValuePragmaExpressionSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::PragmaExpressionSyntax&>
                     (unaff_retaddr,(Token *)__fn,args_1,(PragmaExpressionSyntax *)args_2);
  return (int)pNVar1;
}

Assistant:

static SyntaxNode* clone(const NameValuePragmaExpressionSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<NameValuePragmaExpressionSyntax>(
        node.name.deepClone(alloc),
        node.equals.deepClone(alloc),
        *deepClone<PragmaExpressionSyntax>(*node.value, alloc)
    );
}